

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O0

int __thiscall LockstepScheduler::usleep_until(LockstepScheduler *this,uint64_t time_us)

{
  int *piVar1;
  int result;
  pthread_cond_t cond;
  pthread_mutex_t lock;
  int local_6c;
  pthread_cond_t local_68;
  pthread_mutex_t local_38;
  
  pthread_mutex_init(&local_38,(pthread_mutexattr_t *)0x0);
  pthread_cond_init(&local_68,(pthread_condattr_t *)0x0);
  pthread_mutex_lock(&local_38);
  local_6c = cond_timedwait((LockstepScheduler *)cond.__data.__g_size,
                            (pthread_cond_t *)cond.__data.__g_refs,
                            (pthread_mutex_t *)cond.__data.__g1_start,cond.__align);
  if (local_6c == -1) {
    piVar1 = __errno_location();
    if (*piVar1 == 0x6e) {
      piVar1 = __errno_location();
      *piVar1 = 0;
      local_6c = 0;
    }
  }
  pthread_mutex_unlock(&local_38);
  pthread_cond_destroy(&local_68);
  pthread_mutex_destroy(&local_38);
  return local_6c;
}

Assistant:

int LockstepScheduler::usleep_until(uint64_t time_us)
{
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    pthread_mutex_lock(&lock);

    int result = cond_timedwait(&cond, &lock, time_us);

    if (result == -1 && errno == ETIMEDOUT) {
        // This is expected because we never notified to the condition.
        errno = 0;
        result = 0;
    }

    pthread_mutex_unlock(&lock);

    pthread_cond_destroy(&cond);
    pthread_mutex_destroy(&lock);

    return result;
}